

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cave-square.c
# Opt level: O3

_Bool square_changeable(chunk_conflict *c,loc grid)

{
  _Bool _Var1;
  square *psVar2;
  object *poVar3;
  
  psVar2 = square(c,grid);
  _Var1 = flag_has_dbg(f_info[psVar2->feat].flags,6,5,"f_info[feat].flags","TF_PERMANENT");
  if (_Var1) {
    _Var1 = false;
  }
  else {
    poVar3 = square_object(c,grid);
    if (poVar3 == (object *)0x0) {
      _Var1 = true;
    }
    else {
      do {
        _Var1 = poVar3->artifact == (artifact *)0x0;
        if (!_Var1) {
          return _Var1;
        }
        poVar3 = poVar3->next;
      } while (poVar3 != (object *)0x0);
    }
  }
  return _Var1;
}

Assistant:

bool square_changeable(struct chunk *c, struct loc grid)
{
	struct object *obj;

	/* Forbid perma-grids */
	if (square_ispermanent(c, grid))
		return (false);

	/* Check objects */
	for (obj = square_object(c, grid); obj; obj = obj->next)
		/* Forbid artifact grids */
		if (obj->artifact) return (false);

	/* Accept */
	return (true);
}